

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask26_8(uint32_t *in,uint32_t *out)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  bVar1 = *(byte *)((long)in + 0x13);
  uVar2 = in[6];
  auVar5 = vpshufd_avx(*(undefined1 (*) [16])(in + 1),0xe9);
  auVar7 = vpsrlvd_avx2(auVar5,_DAT_001a1380);
  auVar6 = vpsllvd_avx2(*(undefined1 (*) [16])(in + 1),_DAT_001a1a50);
  auVar5 = vpinsrd_avx(ZEXT416(*in),in[1] >> 6,1);
  uVar3 = in[5];
  uVar4 = in[7];
  auVar5 = vpunpcklqdq_avx(auVar5,auVar7);
  auVar5 = vpor_avx(auVar6,auVar5);
  *(undefined1 (*) [16])out = auVar5;
  out[4] = uVar2 << 0x1c | uVar3 << 2 | (uint)bVar1;
  out[5] = uVar4 << 0x16 | uVar2 >> 4;
  out[6] = uVar4 >> 10;
  return out + 7;
}

Assistant:

uint32_t *__fastpackwithoutmask26_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (26 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (26 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (26 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (26 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (26 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (26 - 16);
  ++in;

  return out + 1;
}